

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O3

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  size_t sVar1;
  String *extraout_RDX;
  scoped_ptr<testing::internal::String> sVar2;
  Message MVar3;
  char *pcVar4;
  ostream *poVar5;
  bool bVar6;
  AssertionResult AVar7;
  Message local_40;
  _anonymous_namespace_ *local_38;
  
  pcVar4 = *needle;
  __haystack = *haystack;
  local_38 = this;
  if (pcVar4 == (char *)0x0 || __haystack == (char *)0x0) {
    bVar6 = pcVar4 == __haystack;
    sVar2.ptr_ = (String *)needle_expr;
  }
  else {
    pcVar4 = strstr(__haystack,pcVar4);
    bVar6 = pcVar4 != (char *)0x0;
    sVar2.ptr_ = extraout_RDX;
  }
  if (bVar6 == expected_to_be_substring) {
    AVar7.message_.ptr_ = sVar2.ptr_;
    AVar7._0_8_ = local_38;
    *local_38 = (_anonymous_namespace_)0x1;
    *(undefined8 *)(local_38 + 8) = 0;
  }
  else {
    Message::Message(&local_40);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Value of: ",10);
    if (needle_expr == (char *)0x0) {
      MVar3.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      needle_expr = "(null)";
    }
    else {
      MVar3.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar3.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(needle_expr);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar3.ss_,needle_expr,sVar1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  Actual: ",10);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    pcVar4 = *needle;
    if (pcVar4 == (char *)0x0) {
      MVar3.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      pcVar4 = "(null)";
    }
    else {
      MVar3.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar3.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(pcVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar3.ss_,pcVar4,sVar1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"\n",2);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Expected: ",10);
    pcVar4 = "not ";
    if (expected_to_be_substring) {
      pcVar4 = "";
    }
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,pcVar4,(ulong)!expected_to_be_substring << 2);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"a substring of ",0xf);
    if (haystack_expr == (char *)0x0) {
      MVar3.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      haystack_expr = "(null)";
    }
    else {
      MVar3.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar3.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(haystack_expr);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar3.ss_,haystack_expr,sVar1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Which is: ",10);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    pcVar4 = *haystack;
    if (pcVar4 == (char *)0x0) {
      MVar3.ss_ = local_40.ss_ + 0x10;
      sVar1 = 6;
      pcVar4 = "(null)";
    }
    else {
      MVar3.ss_ = local_40.ss_;
      if (local_40.ss_ != (StrStream *)0x0) {
        MVar3.ss_ = (StrStream *)(local_40.ss_ + 0x10);
      }
      sVar1 = strlen(pcVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)MVar3.ss_,pcVar4,sVar1);
    poVar5 = (ostream *)(local_40.ss_ + 0x10);
    if (local_40.ss_ == (StrStream *)0x0) {
      poVar5 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
    AVar7 = AssertionFailure((testing *)local_38,&local_40);
    if (local_40.ss_ != (StrStream *)0x0) {
      AVar7 = (AssertionResult)(**(code **)(*(long *)local_40.ss_ + 8))();
    }
  }
  return AVar7;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure(
      Message()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"");
}